

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleTimestampCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  undefined8 name;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *value;
  ulong __n;
  undefined1 local_118 [8];
  string result;
  undefined1 local_f0 [3];
  cmTimestamp timestamp;
  undefined1 local_d0 [8];
  string e;
  undefined1 local_a8 [7];
  bool utcFlag;
  string formatString;
  string *outputVariable;
  uint argsIndex;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command TIMESTAMP requires at least one argument.",&local_41
              );
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
    goto LAB_00458b0c;
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (4 < sVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argsIndex,"sub-command TIMESTAMP takes at most three arguments.",
               (allocator<char> *)((long)&outputVariable + 7));
    cmCommand::SetError(&this->super_cmCommand,(string *)&argsIndex);
    std::__cxx11::string::~string((string *)&argsIndex);
    std::allocator<char>::~allocator((allocator<char> *)((long)&outputVariable + 7));
    this_local._7_1_ = 0;
    goto LAB_00458b0c;
  }
  outputVariable._0_4_ = 2;
  formatString.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[](local_20,1);
  std::__cxx11::string::string((string *)local_a8);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if ((uint)outputVariable < sVar2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,(ulong)(uint)outputVariable);
    bVar1 = std::operator!=(pvVar3,"UTC");
    if (bVar1) {
      __n = (ulong)(uint)outputVariable;
      outputVariable._0_4_ = (uint)outputVariable + 1;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,__n);
      std::__cxx11::string::operator=((string *)local_a8,(string *)pvVar3);
    }
  }
  e.field_2._M_local_buf[0xf] = '\0';
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if ((uint)outputVariable < sVar2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,(ulong)(uint)outputVariable);
    bVar1 = std::operator==(pvVar3,"UTC");
    if (bVar1) {
      e.field_2._M_local_buf[0xf] = '\x01';
      goto LAB_00458a53;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,(ulong)(uint)outputVariable);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   " TIMESTAMP sub-command does not recognize option ",pvVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,"."
                  );
    std::__cxx11::string::~string((string *)local_f0);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_d0);
    this_local._7_1_ = 0;
    result.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_d0);
  }
  else {
LAB_00458a53:
    cmTimestamp::CurrentTime
              ((string *)local_118,(cmTimestamp *)(result.field_2._M_local_buf + 0xb),
               (string *)local_a8,(bool)(e.field_2._M_local_buf[0xf] & 1));
    name = formatString.field_2._8_8_;
    this_00 = (this->super_cmCommand).Makefile;
    value = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)name,value);
    this_local._7_1_ = 1;
    result.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_118);
  }
  std::__cxx11::string::~string((string *)local_a8);
LAB_00458b0c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleTimestampCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("sub-command TIMESTAMP requires at least one argument.");
    return false;
  }
  if (args.size() > 4) {
    this->SetError("sub-command TIMESTAMP takes at most three arguments.");
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& outputVariable = args[argsIndex++];

  std::string formatString;
  if (args.size() > argsIndex && args[argsIndex] != "UTC") {
    formatString = args[argsIndex++];
  }

  bool utcFlag = false;
  if (args.size() > argsIndex) {
    if (args[argsIndex] == "UTC") {
      utcFlag = true;
    } else {
      std::string e = " TIMESTAMP sub-command does not recognize option " +
        args[argsIndex] + ".";
      this->SetError(e);
      return false;
    }
  }

  cmTimestamp timestamp;
  std::string result = timestamp.CurrentTime(formatString, utcFlag);
  this->Makefile->AddDefinition(outputVariable, result.c_str());

  return true;
}